

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall duckdb_re2::DFA::InlinedSearchLoop<true,false,true>(DFA *this,SearchParams *params)

{
  byte *pbVar1;
  byte bVar2;
  size_type sVar3;
  bool bVar4;
  uint uVar5;
  State *pSVar6;
  State *pSVar7;
  byte *pbVar8;
  State *pSVar9;
  long lVar10;
  int *__dest;
  ulong uVar11;
  byte *data;
  size_t sVar12;
  Prog *pPVar13;
  uint c;
  byte *local_240;
  byte *local_230;
  int *local_228;
  bool local_220;
  State *local_218;
  StateSaver local_208;
  Prog *local_1e0;
  StateSaver local_1d8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_218 = params->start;
  data = (byte *)(params->text).data_;
  sVar3 = (params->text).size_;
  pPVar13 = this->prog_;
  if ((local_218->flag_ & 0x100) == 0) {
    local_240 = (byte *)0x0;
    local_220 = false;
  }
  else {
    local_220 = true;
    local_240 = data;
    if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
       (0 < (long)local_218->ninst_)) {
      uVar11 = (long)local_218->ninst_ + 1;
      do {
        if (local_218->inst_[uVar11 - 2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,local_218->inst_[uVar11 - 2]);
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
  }
  pbVar1 = data + sVar3;
  pSVar6 = local_218;
  if (sVar3 != 0) {
    local_230 = (byte *)0x0;
    pSVar9 = local_218;
    local_1e0 = pPVar13;
    do {
      pbVar8 = data;
      if ((pSVar9 == local_218) &&
         (pbVar8 = (byte *)Prog::PrefixAccel(this->prog_,data,(long)pbVar1 - (long)data),
         data = pbVar1, pSVar6 = pSVar9, pbVar8 == (byte *)0x0)) break;
      data = pbVar8 + 1;
      bVar2 = *pbVar8;
      pSVar6 = pSVar9->next_[pPVar13->bytemap_[bVar2]]._M_b._M_p;
      if (pSVar6 == (State *)0x0) {
        pSVar6 = RunStateOnByteUnlocked(this,pSVar9,(uint)bVar2);
        if (pSVar6 == (State *)0x0) {
          if (((dfa_should_bail_when_slow == '\x01') && (local_230 != (byte *)0x0)) &&
             (((ulong)((long)data - (long)local_230) <
               (this->state_cache_)._M_h._M_element_count * 10 && (this->kind_ != kManyMatch)))) {
            params->failed = true;
            return false;
          }
          if (local_218 < (State *)0x3) {
            local_208.inst_ = (int *)0x0;
            local_208.ninst_ = 0;
            local_208.flag_ = 0;
            local_208.is_special_ = true;
            local_208.special_ = local_218;
            local_230 = (byte *)0x0;
            local_208.dfa_ = this;
          }
          else {
            local_208.is_special_ = false;
            local_208.special_ = (State *)0x0;
            local_208.ninst_ = local_218->ninst_;
            local_208.flag_ = local_218->flag_;
            lVar10 = (long)local_208.ninst_;
            sVar12 = lVar10 * 4;
            if (local_208.ninst_ < 0) {
              sVar12 = 0xffffffffffffffff;
            }
            local_208.dfa_ = this;
            local_230 = (byte *)operator_new__(sVar12);
            local_208.inst_ = (int *)local_230;
            memmove(local_230,local_218->inst_,lVar10 * 4);
          }
          local_1d8.dfa_ = this;
          if (pSVar9 < (State *)0x3) {
            local_1d8.inst_ = (int *)0x0;
            local_1d8.ninst_ = 0;
            local_1d8.flag_ = 0;
            local_1d8.is_special_ = true;
            local_228 = (int *)0x0;
            local_1d8.special_ = pSVar9;
          }
          else {
            local_1d8.is_special_ = false;
            local_1d8.special_ = (State *)0x0;
            local_1d8.ninst_ = pSVar9->ninst_;
            local_1d8.flag_ = pSVar9->flag_;
            lVar10 = (long)local_1d8.ninst_;
            sVar12 = lVar10 * 4;
            if (local_1d8.ninst_ < 0) {
              sVar12 = 0xffffffffffffffff;
            }
            local_228 = (int *)operator_new__(sVar12);
            local_1d8.inst_ = local_228;
            memmove(local_228,pSVar9->inst_,lVar10 * 4);
          }
          ResetCache(this,params->cache_lock);
          pSVar7 = StateSaver::Restore(&local_208);
          if ((pSVar7 == (State *)0x0) ||
             (pSVar6 = StateSaver::Restore(&local_1d8), pSVar6 == (State *)0x0)) {
LAB_01832ec3:
            params->failed = true;
            bVar4 = false;
            pSVar6 = (State *)0x0;
          }
          else {
            pSVar6 = RunStateOnByteUnlocked(this,pSVar6,(uint)bVar2);
            if (pSVar6 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after ResetCache",0x2e)
              ;
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_01832ec3;
            }
            bVar4 = true;
          }
          if (((State *)0x2 < pSVar9) && (local_228 != (int *)0x0)) {
            operator_delete__(local_228);
          }
          if (((State *)0x2 < local_218) && (local_230 != (byte *)0x0)) {
            operator_delete__(local_230);
          }
          pPVar13 = local_1e0;
          local_230 = data;
          local_218 = pSVar7;
          if (!bVar4) {
            return false;
          }
        }
      }
      if (pSVar6 < (State *)0x3) {
        if (pSVar6 == (State *)&DAT_00000001) goto LAB_0183312a;
        goto LAB_0183311d;
      }
      if (((((pSVar6->flag_ & 0x100) != 0) &&
           (local_220 = true, local_240 = pbVar8, params->matches != (SparseSet *)0x0)) &&
          (this->kind_ == kManyMatch)) && (0 < (long)pSVar6->ninst_)) {
        uVar11 = (long)pSVar6->ninst_ + 1;
        do {
          if (pSVar6->inst_[uVar11 - 2] == -2) break;
          SparseSetT<void>::InsertInternal(params->matches,true,pSVar6->inst_[uVar11 - 2]);
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
      }
      pSVar9 = pSVar6;
    } while (data != pbVar1);
  }
  pbVar8 = (byte *)((params->text).data_ + (params->text).size_);
  if (pbVar8 == (byte *)((params->context).data_ + (params->context).size_)) {
    uVar5 = this->prog_->bytemap_range_;
    c = 0x100;
  }
  else {
    bVar2 = *pbVar8;
    c = (uint)bVar2;
    uVar5 = (uint)this->prog_->bytemap_[bVar2];
  }
  pSVar9 = pSVar6->next_[(int)uVar5]._M_b._M_p;
  if ((pSVar9 != (State *)0x0) ||
     (pSVar9 = RunStateOnByteUnlocked(this,pSVar6,c), pSVar9 != (State *)0x0)) goto LAB_018330b8;
  if (pSVar6 < (State *)0x3) {
    local_208.inst_ = (int *)0x0;
    local_208.ninst_ = 0;
    local_208.flag_ = 0;
    local_208.is_special_ = true;
    __dest = (int *)0x0;
    local_208.dfa_ = this;
    local_208.special_ = pSVar6;
  }
  else {
    local_208.is_special_ = false;
    local_208.special_ = (State *)0x0;
    local_208.ninst_ = pSVar6->ninst_;
    local_208.flag_ = pSVar6->flag_;
    lVar10 = (long)local_208.ninst_;
    uVar11 = 0xffffffffffffffff;
    if (-1 < local_208.ninst_) {
      uVar11 = lVar10 * 4;
    }
    local_208.dfa_ = this;
    __dest = (int *)operator_new__(uVar11);
    local_208.inst_ = __dest;
    memmove(__dest,pSVar6->inst_,lVar10 * 4);
  }
  ResetCache(this,params->cache_lock);
  pSVar9 = StateSaver::Restore(&local_208);
  if (pSVar9 == (State *)0x0) {
LAB_01833091:
    params->failed = true;
    bVar4 = false;
    pSVar9 = (State *)0x0;
  }
  else {
    pSVar9 = RunStateOnByteUnlocked(this,pSVar9,c);
    if (pSVar9 == (State *)0x0) {
      local_1b0 = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after Reset",0x29);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_01833091;
    }
    bVar4 = true;
  }
  if (((State *)0x2 < pSVar6) && (__dest != (int *)0x0)) {
    operator_delete__(__dest);
  }
  if (!bVar4) {
    return false;
  }
LAB_018330b8:
  if (pSVar9 < (State *)0x3) {
    if (pSVar9 != (State *)&DAT_00000001) {
LAB_0183311d:
      params->ep = (char *)pbVar1;
      return true;
    }
  }
  else if (((((pSVar9->flag_ & 0x100) != 0) &&
            (local_220 = true, local_240 = data, params->matches != (SparseSet *)0x0)) &&
           (this->kind_ == kManyMatch)) && (0 < (long)pSVar9->ninst_)) {
    uVar11 = (long)pSVar9->ninst_ + 1;
    do {
      if (pSVar9->inst_[uVar11 - 2] == -2) break;
      SparseSetT<void>::InsertInternal(params->matches,true,pSVar9->inst_[uVar11 - 2]);
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
  }
LAB_0183312a:
  params->ep = (char *)local_240;
  return local_220;
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {

    if (can_prefix_accel && s == start) {
      // In start state, only way out is to find the prefix,
      // so we use prefix accel (e.g. memchr) to skip ahead.
      // If not found, we can skip to the end of the string.
      p = BytePtr(prog_->PrefixAccel(p, ep - p));
      if (p == NULL) {
        p = ep;
        break;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)

  int lastbyte;
  if (run_forward) {
    if (EndPtr(params->text) == EndPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = EndPtr(params->text)[0] & 0xFF;
  } else {
    if (BeginPtr(params->text) == BeginPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = BeginPtr(params->text)[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}